

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase98::run(TestCase98 *this)

{
  __pid_t _Var1;
  __pid_t local_ac;
  int local_a8;
  bool local_a1;
  undefined4 *puStack_a0;
  bool _kj_shouldLog;
  undefined1 local_91 [17];
  undefined4 local_80;
  Type local_79;
  int line;
  Promise<int> promise;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase98 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  evalLater<kj::(anonymous_namespace)::TestCase98::run()::__0>((kj *)&line,&local_79);
  local_80 = 0x67;
  puStack_a0 = &local_80;
  Promise<int>::
  then<kj::(anonymous_namespace)::TestCase98::run()::__1,kj::(anonymous_namespace)::TestCase98::run()::__2>
            ((Promise<int> *)(local_91 + 1),(Type *)&line,(Type *)local_91);
  Promise<int>::operator=((Promise<int> *)&line,(Promise<int> *)(local_91 + 1));
  Promise<int>::~Promise((Promise<int> *)(local_91 + 1));
  _Var1 = Promise<int>::wait((Promise<int> *)&line,local_58);
  if (_Var1 != 0x159) {
    local_a1 = _::Debug::shouldLog(ERROR);
    while (local_a1 != false) {
      local_a8 = 0x159;
      local_ac = Promise<int>::wait((Promise<int> *)&line,local_58);
      _::Debug::log<char_const(&)[52],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x6e,ERROR,
                 "\"failed: expected \" \"(345) == (promise.wait(waitScope))\", 345, promise.wait(waitScope)"
                 ,(char (*) [52])"failed: expected (345) == (promise.wait(waitScope))",&local_a8,
                 &local_ac);
      local_a1 = false;
    }
  }
  Promise<int>::~Promise((Promise<int> *)&line);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, HandleException) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater(
      [&]() -> int { KJ_FAIL_ASSERT("foo") { return 123; } });
  int line = __LINE__ - 1;

  promise = promise.then(
      [](int i) { return i + 1; },
      [&](Exception&& e) { EXPECT_EQ(line, e.getLine()); return 345; });

  EXPECT_EQ(345, promise.wait(waitScope));
}